

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::SetRenderTargets
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,Uint32 NumRenderTargets,
          ITextureView **ppRenderTargets,ITextureView *pDepthStencil,
          RESOURCE_STATE_TRANSITION_MODE StateTransitionMode)

{
  SetRenderTargetsAttribs local_58;
  RESOURCE_STATE_TRANSITION_MODE local_29;
  ITextureView *pIStack_28;
  RESOURCE_STATE_TRANSITION_MODE StateTransitionMode_local;
  ITextureView *pDepthStencil_local;
  ITextureView **ppRenderTargets_local;
  DeviceContextBase<Diligent::EngineVkImplTraits> *pDStack_10;
  Uint32 NumRenderTargets_local;
  DeviceContextBase<Diligent::EngineVkImplTraits> *this_local;
  
  local_29 = StateTransitionMode;
  pIStack_28 = pDepthStencil;
  pDepthStencil_local = (ITextureView *)ppRenderTargets;
  ppRenderTargets_local._4_4_ = NumRenderTargets;
  pDStack_10 = this;
  SetRenderTargetsAttribs::SetRenderTargetsAttribs
            (&local_58,NumRenderTargets,ppRenderTargets,pDepthStencil,StateTransitionMode,
             (ITextureView *)0x0);
  (*(this->super_ObjectBase<Diligent::IDeviceContextVk>).
    super_RefCountedObject<Diligent::IDeviceContextVk>.super_IDeviceContextVk.super_IDeviceContext.
    super_IObject._vptr_IObject[0x11])(this,&local_58);
  return;
}

Assistant:

SetRenderTargets(Uint32                         NumRenderTargets,
                                                     ITextureView*                  ppRenderTargets[],
                                                     ITextureView*                  pDepthStencil,
                                                     RESOURCE_STATE_TRANSITION_MODE StateTransitionMode) override final
    {
        return this->SetRenderTargetsExt({NumRenderTargets, ppRenderTargets, pDepthStencil, StateTransitionMode});
    }